

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

int N_VLinearCombination_Serial(int nvec,realtype *c,N_Vector *X,N_Vector z)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long *in_RCX;
  undefined8 *in_RDX;
  double *in_RSI;
  int in_EDI;
  realtype *xd;
  realtype *zd;
  sunindextype N;
  sunindextype j;
  int i;
  undefined4 in_stack_00000044;
  N_Vector in_stack_00000048;
  realtype in_stack_00000050;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar4;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar5;
  int local_4;
  
  if (in_EDI < 1) {
    local_4 = -1;
  }
  else if (in_EDI == 1) {
    N_VScale_Serial((realtype)in_RCX,
                    (N_Vector)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                    (N_Vector)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    local_4 = 0;
  }
  else if (in_EDI == 2) {
    N_VLinearSum_Serial(in_stack_00000050,in_stack_00000048,
                        (realtype)CONCAT44(in_stack_00000044,nvec),(N_Vector)c,(N_Vector)X);
    local_4 = 0;
  }
  else {
    iVar1 = *(int *)*in_RCX;
    lVar2 = *(long *)(*in_RCX + 8);
    if ((((long *)*in_RDX != in_RCX) || (*in_RSI != 1.0)) || (NAN(*in_RSI))) {
      if ((long *)*in_RDX == in_RCX) {
        for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
          *(double *)(lVar2 + (long)iVar5 * 8) = *in_RSI * *(double *)(lVar2 + (long)iVar5 * 8);
        }
        for (iVar5 = 1; iVar5 < in_EDI; iVar5 = iVar5 + 1) {
          lVar3 = *(long *)(*(long *)in_RDX[iVar5] + 8);
          for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
            *(double *)(lVar2 + (long)iVar4 * 8) =
                 in_RSI[iVar5] * *(double *)(lVar3 + (long)iVar4 * 8) +
                 *(double *)(lVar2 + (long)iVar4 * 8);
          }
        }
        local_4 = 0;
      }
      else {
        lVar3 = *(long *)(*(long *)*in_RDX + 8);
        for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
          *(double *)(lVar2 + (long)iVar5 * 8) = *in_RSI * *(double *)(lVar3 + (long)iVar5 * 8);
        }
        for (iVar5 = 1; iVar5 < in_EDI; iVar5 = iVar5 + 1) {
          lVar3 = *(long *)(*(long *)in_RDX[iVar5] + 8);
          for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
            *(double *)(lVar2 + (long)iVar4 * 8) =
                 in_RSI[iVar5] * *(double *)(lVar3 + (long)iVar4 * 8) +
                 *(double *)(lVar2 + (long)iVar4 * 8);
          }
        }
        local_4 = 0;
      }
    }
    else {
      for (iVar5 = 1; iVar5 < in_EDI; iVar5 = iVar5 + 1) {
        lVar3 = *(long *)(*(long *)in_RDX[iVar5] + 8);
        for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
          *(double *)(lVar2 + (long)iVar4 * 8) =
               in_RSI[iVar5] * *(double *)(lVar3 + (long)iVar4 * 8) +
               *(double *)(lVar2 + (long)iVar4 * 8);
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int N_VLinearCombination_Serial(int nvec, realtype* c, N_Vector* X, N_Vector z)
{
  int          i;
  sunindextype j, N;
  realtype*    zd=NULL;
  realtype*    xd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VScale */
  if (nvec == 1) {
    N_VScale_Serial(c[0], X[0], z);
    return(0);
  }

  /* should have called N_VLinearSum */
  if (nvec == 2) {
    N_VLinearSum_Serial(c[0], X[0], c[1], X[1], z);
    return(0);
  }

  /* get vector length and data array */
  N  = NV_LENGTH_S(z);
  zd = NV_DATA_S(z);

  /*
   * X[0] += c[i]*X[i], i = 1,...,nvec-1
   */
  if ((X[0] == z) && (c[0] == ONE)) {
    for (i=1; i<nvec; i++) {
      xd = NV_DATA_S(X[i]);
      for (j=0; j<N; j++) {
        zd[j] += c[i] * xd[j];
      }
    }
    return(0);
  }

  /*
   * X[0] = c[0] * X[0] + sum{ c[i] * X[i] }, i = 1,...,nvec-1
   */
  if (X[0] == z) {
    for (j=0; j<N; j++) {
      zd[j] *= c[0];
    }
    for (i=1; i<nvec; i++) {
      xd = NV_DATA_S(X[i]);
      for (j=0; j<N; j++) {
        zd[j] += c[i] * xd[j];
      }
    }
    return(0);
  }

  /*
   * z = sum{ c[i] * X[i] }, i = 0,...,nvec-1
   */
  xd = NV_DATA_S(X[0]);
  for (j=0; j<N; j++) {
    zd[j] = c[0] * xd[j];
  }
  for (i=1; i<nvec; i++) {
    xd = NV_DATA_S(X[i]);
    for (j=0; j<N; j++) {
      zd[j] += c[i] * xd[j];
    }
  }
  return(0);
}